

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool __thiscall Catch::Clara::Opt::isMatch(Opt *this,StringRef optToken)

{
  StringRef optName;
  StringRef optName_00;
  StringRef other;
  bool bVar1;
  reference pSVar2;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *in_RDI;
  StringRef *name;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *__range2;
  StringRef normalisedToken;
  StringRef *in_stack_ffffffffffffff70;
  char *pcVar3;
  __normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
  local_50;
  pointer *local_48;
  StringRef local_30;
  
  optName.m_size = (size_type)in_stack_ffffffffffffff70;
  optName.m_start = (char *)in_RDI;
  local_30 = anon_unknown.dwarf_18d5be::normaliseOpt(optName);
  local_48 = &in_RDI[2].super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_50._M_current =
       (StringRef *)std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::begin(in_RDI);
  std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
                        *)in_stack_ffffffffffffff70,
                       (__normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
                        *)in_RDI);
    if (!bVar1) {
      return false;
    }
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
             ::operator*(&local_50);
    pcVar3 = pSVar2->m_start;
    optName_00.m_size = (size_type)in_stack_ffffffffffffff70;
    optName_00.m_start = (char *)in_RDI;
    anon_unknown.dwarf_18d5be::normaliseOpt(optName_00);
    other.m_size = (size_type)pcVar3;
    other.m_start = (char *)local_30.m_size;
    in_stack_ffffffffffffff70 = (StringRef *)local_30.m_start;
    bVar1 = StringRef::operator==((StringRef *)local_30.m_start,other);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
    ::operator++(&local_50);
  }
  return true;
}

Assistant:

bool Opt::isMatch(StringRef optToken) const {
            auto normalisedToken = normaliseOpt(optToken);
            for (auto const& name : m_optNames) {
                if (normaliseOpt(name) == normalisedToken)
                    return true;
            }
            return false;
        }